

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.hpp
# Opt level: O0

void __thiscall
websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::
proxy_write(connection<websocketpp::config::asio_client::transport_config> *this,
           init_handler *callback)

{
  timer_handler *callback_00;
  bool bVar1;
  element_type *peVar2;
  element_type *this_00;
  request *this_01;
  element_type *peVar3;
  void *data;
  size_t size_in_bytes;
  socket *s;
  element_type *this_02;
  size_t in_RCX;
  shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::proxy_data>
  *this_03;
  error_code eVar4;
  undefined1 local_1b8 [96];
  wrapped_handler<boost::asio::io_context::strand,_std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::function<void_(const_std::error_code_&)>,_const_boost::system::error_code_&)>,_boost::asio::detail::is_continuation_if_running>
  local_158;
  undefined1 local_f8 [96];
  function<void_(const_std::error_code_&)> local_98;
  undefined1 local_78 [48];
  string local_48;
  error_code local_28;
  undefined8 local_18;
  init_handler *callback_local;
  connection<websocketpp::config::asio_client::transport_config> *this_local;
  
  local_18 = callback;
  callback_local = (init_handler *)this;
  peVar2 = std::
           __shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_alog);
  bVar1 = log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::static_test
                    (peVar2,0x400);
  if (bVar1) {
    peVar2 = std::
             __shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_alog);
    log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
              (peVar2,0x400,"asio connection proxy_write",in_RCX);
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_proxy_data);
  if (bVar1) {
    this_03 = &this->m_proxy_data;
    this_01 = (request *)
              std::
              __shared_ptr_access<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::proxy_data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::proxy_data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this_03);
    http::parser::request::raw_abi_cxx11_(&local_48,this_01);
    peVar3 = std::
             __shared_ptr_access<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::proxy_data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::proxy_data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this_03);
    std::__cxx11::string::operator=((string *)(peVar3 + 0x1b8),(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::
    __shared_ptr_access<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::proxy_data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::proxy_data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)this_03);
    data = (void *)std::__cxx11::string::data();
    std::
    __shared_ptr_access<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::proxy_data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::proxy_data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)this_03);
    size_in_bytes = std::__cxx11::string::size();
    local_78._16_16_ = (undefined1  [16])boost::asio::buffer(data,size_in_bytes);
    boost::asio::const_buffer::const_buffer
              ((const_buffer *)(local_78 + 0x20),(mutable_buffer *)(local_78 + 0x10));
    std::vector<boost::asio::const_buffer,_std::allocator<boost::asio::const_buffer>_>::push_back
              (&this->m_bufs,(const_buffer *)(local_78 + 0x20));
    peVar2 = std::
             __shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_alog);
    peVar3 = std::
             __shared_ptr_access<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::proxy_data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::proxy_data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this_03);
    log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
              (peVar2,0x400,peVar3 + 0x1b8,in_RCX);
    peVar3 = std::
             __shared_ptr_access<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::proxy_data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::proxy_data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this_03);
    callback_00 = *(timer_handler **)(peVar3 + 0x238);
    local_f8._16_8_ = handle_proxy_timeout;
    local_f8._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    get_shared((connection<websocketpp::config::asio_client::transport_config> *)local_f8);
    std::
    bind<void(websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::*)(std::function<void(std::error_code_const&)>,std::error_code_const&),std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>>,std::function<void(std::error_code_const&)>&,std::_Placeholder<1>const&>
              ((type *)(local_f8 + 0x20),
               (offset_in_connection<websocketpp::config::asio_client::transport_config>_to_subr *)
               (local_f8 + 0x10),
               (shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>_>
                *)local_f8,callback,(_Placeholder<1> *)&std::placeholders::_1);
    std::function<void(std::error_code_const&)>::
    function<std::_Bind<void(websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>>,std::function<void(std::error_code_const&)>,std::_Placeholder<1>))(std::function<void(std::error_code_const&)>,std::error_code_const&)>,void>
              ((function<void(std::error_code_const&)> *)&local_98,
               (_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&)>
                *)(local_f8 + 0x20));
    set_timer((connection<websocketpp::config::asio_client::transport_config> *)local_78,(long)this,
              callback_00);
    peVar3 = std::
             __shared_ptr_access<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::proxy_data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::proxy_data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_proxy_data);
    std::
    shared_ptr<boost::asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
    ::operator=((shared_ptr<boost::asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                 *)(peVar3 + 0x240),
                (shared_ptr<boost::asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                 *)local_78);
    std::
    shared_ptr<boost::asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
    ::~shared_ptr((shared_ptr<boost::asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                   *)local_78);
    std::function<void_(const_std::error_code_&)>::~function(&local_98);
    std::
    _Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&)>
    ::~_Bind((_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&)>
              *)(local_f8 + 0x20));
    std::
    shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>_>
    ::~shared_ptr((shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>_>
                   *)local_f8);
    s = basic_socket::connection::get_next_layer(&this->super_socket_con_type);
    this_02 = std::
              __shared_ptr_access<boost::asio::io_context::strand,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<boost::asio::io_context::strand,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->m_strand);
    local_1b8._16_8_ = handle_proxy_write;
    local_1b8._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    get_shared((connection<websocketpp::config::asio_client::transport_config> *)local_1b8);
    std::
    bind<void(websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::*)(std::function<void(std::error_code_const&)>,boost::system::error_code_const&),std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>>,std::function<void(std::error_code_const&)>&,std::_Placeholder<1>const&>
              ((type *)(local_1b8 + 0x20),
               (offset_in_connection<websocketpp::config::asio_client::transport_config>_to_subr *)
               (local_1b8 + 0x10),
               (shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>_>
                *)local_1b8,callback,(_Placeholder<1> *)&std::placeholders::_1);
    boost::asio::io_context::strand::
    wrap<std::_Bind<void(websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>>,std::function<void(std::error_code_const&)>,std::_Placeholder<1>))(std::function<void(std::error_code_const&)>,boost::system::error_code_const&)>>
              (&local_158,this_02,
               (_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::function<void_(const_std::error_code_&)>,_const_boost::system::error_code_&)>
                *)(local_1b8 + 0x20));
    boost::asio::
    async_write<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,std::vector<boost::asio::const_buffer,std::allocator<boost::asio::const_buffer>>,boost::asio::detail::wrapped_handler<boost::asio::io_context::strand,std::_Bind<void(websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>>,std::function<void(std::error_code_const&)>,std::_Placeholder<1>))(std::function<void(std::error_code_const&)>,boost::system::error_code_const&)>,boost::asio::detail::is_continuation_if_running>>
              (s,&this->m_bufs,&local_158,(type *)0x0);
    boost::asio::detail::
    wrapped_handler<boost::asio::io_context::strand,_std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::function<void_(const_std::error_code_&)>,_const_boost::system::error_code_&)>,_boost::asio::detail::is_continuation_if_running>
    ::~wrapped_handler(&local_158);
    std::
    _Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::function<void_(const_std::error_code_&)>,_const_boost::system::error_code_&)>
    ::~_Bind((_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::function<void_(const_std::error_code_&)>,_const_boost::system::error_code_&)>
              *)(local_1b8 + 0x20));
    std::
    shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>_>
    ::~shared_ptr((shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>_>
                   *)local_1b8);
  }
  else {
    this_00 = std::
              __shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->m_elog);
    log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>::write
              (this_00,2,"assertion failed: !m_proxy_data in asio::connection::proxy_write",in_RCX);
    eVar4 = asio::error::make_error_code(general);
    local_28._M_cat = eVar4._M_cat;
    local_28._M_value = eVar4._M_value;
    std::function<void_(const_std::error_code_&)>::operator()(callback,&local_28);
  }
  return;
}

Assistant:

void proxy_write(init_handler callback) {
        if (m_alog->static_test(log::alevel::devel)) {
            m_alog->write(log::alevel::devel,"asio connection proxy_write");
        }

        if (!m_proxy_data) {
            m_elog->write(log::elevel::library,
                "assertion failed: !m_proxy_data in asio::connection::proxy_write");
            callback(make_error_code(error::general));
            return;
        }

        m_proxy_data->write_buf = m_proxy_data->req.raw();

        m_bufs.push_back(lib::asio::buffer(m_proxy_data->write_buf.data(),
                                           m_proxy_data->write_buf.size()));

        m_alog->write(log::alevel::devel,m_proxy_data->write_buf);

        // Set a timer so we don't wait forever for the proxy to respond
        m_proxy_data->timer = this->set_timer(
            m_proxy_data->timeout_proxy,
            lib::bind(
                &type::handle_proxy_timeout,
                get_shared(),
                callback,
                lib::placeholders::_1
            )
        );

        // Send proxy request
        if (config::enable_multithreading) {
            lib::asio::async_write(
                socket_con_type::get_next_layer(),
                m_bufs,
                m_strand->wrap(lib::bind(
                    &type::handle_proxy_write, get_shared(),
                    callback,
                    lib::placeholders::_1
                ))
            );
        } else {
            lib::asio::async_write(
                socket_con_type::get_next_layer(),
                m_bufs,
                lib::bind(
                    &type::handle_proxy_write, get_shared(),
                    callback,
                    lib::placeholders::_1
                )
            );
        }
    }